

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u16 numericType(Mem *pMem)

{
  ushort uVar1;
  int iVar2;
  MemValue MStack_18;
  
  uVar1 = pMem->flags;
  MStack_18._0_4_ = uVar1 & 0x2c;
  MStack_18.i._4_4_ = 0;
  if ((uVar1 & 0x2c) != 0) {
    return (u16)MStack_18._0_4_;
  }
  if ((uVar1 & 0x12) == 0) {
    return 0;
  }
  if ((pMem->flags & 0x4000) != 0) {
    sqlite3VdbeMemExpandBlob(pMem);
  }
  iVar2 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if (iVar2 < 1) {
    if (iVar2 != 0) {
      return 8;
    }
    iVar2 = sqlite3Atoi64(pMem->z,&MStack_18.i,pMem->n,pMem->enc);
    if (1 < iVar2) {
      return 8;
    }
  }
  else {
    if (iVar2 != 1) {
      return 8;
    }
    iVar2 = sqlite3Atoi64(pMem->z,&MStack_18.i,pMem->n,pMem->enc);
    if (iVar2 != 0) {
      return 8;
    }
  }
  pMem->u = MStack_18;
  return 4;
}

Assistant:

static u16 numericType(Mem *pMem){
  if( pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( pMem->flags & MEM_Int );
    testcase( pMem->flags & MEM_Real );
    testcase( pMem->flags & MEM_IntReal );
    return pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal);
  }
  if( pMem->flags & (MEM_Str|MEM_Blob) ){
    testcase( pMem->flags & MEM_Str );
    testcase( pMem->flags & MEM_Blob );
    return computeNumericType(pMem);
  }
  return 0;
}